

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaVAddNodeQName(xmlSchemaValidCtxtPtr vctxt,xmlChar *lname,xmlChar *nsname)

{
  int *piVar1;
  int iVar2;
  xmlSchemaItemListPtr list;
  int iVar3;
  xmlChar *item;
  xmlChar *item_00;
  long lVar4;
  
  item = xmlDictLookup(vctxt->dict,lname,-1);
  if (item != (xmlChar *)0x0) {
    if (nsname == (xmlChar *)0x0) {
      item_00 = (xmlChar *)0x0;
    }
    else {
      item_00 = xmlDictLookup(vctxt->dict,nsname,-1);
      if (item_00 == (xmlChar *)0x0) {
        return -1;
      }
    }
    list = vctxt->nodeQNames;
    iVar2 = list->nbItems;
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        if (((xmlChar *)list->items[lVar4] == item) &&
           ((xmlChar *)list->items[lVar4 + 1] == item_00)) {
          return (int)lVar4;
        }
        lVar4 = lVar4 + 2;
      } while ((int)lVar4 < iVar2);
    }
    iVar3 = xmlSchemaItemListAddSize(list,0x14,item);
    if (-1 < iVar3) {
      iVar3 = xmlSchemaItemListAddSize(vctxt->nodeQNames,0x14,item_00);
      if (-1 < iVar3) {
        return iVar2;
      }
      piVar1 = &vctxt->nodeQNames->nbItems;
      *piVar1 = *piVar1 + -1;
    }
    xmlSchemaVErrMemory(vctxt);
  }
  return -1;
}

Assistant:

static int
xmlSchemaVAddNodeQName(xmlSchemaValidCtxtPtr vctxt,
		       const xmlChar* lname,
		       const xmlChar* nsname)
{
    int i;

    lname = xmlDictLookup(vctxt->dict, lname, -1);
    if (lname == NULL)
	return(-1);
    if (nsname != NULL) {
	nsname = xmlDictLookup(vctxt->dict, nsname, -1);
	if (nsname == NULL)
	    return(-1);
    }
    for (i = 0; i < vctxt->nodeQNames->nbItems; i += 2) {
	if ((vctxt->nodeQNames->items [i] == lname) &&
	    (vctxt->nodeQNames->items[i +1] == nsname))
	    /* Already there */
	    return(i);
    }
    /* Add new entry. */
    i = vctxt->nodeQNames->nbItems;
    if (xmlSchemaItemListAdd(vctxt->nodeQNames, (void *) lname) < 0) {
        xmlSchemaVErrMemory(vctxt);
        return(-1);
    }
    if (xmlSchemaItemListAdd(vctxt->nodeQNames, (void *) nsname) < 0) {
        vctxt->nodeQNames->nbItems--;
        xmlSchemaVErrMemory(vctxt);
        return(-1);
    }
    return(i);
}